

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

int __thiscall cmOrderDirectories::AddOriginalDirectory(cmOrderDirectories *this,string *dir)

{
  iterator __x;
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_int>_&>::value,_pair<iterator,_bool>_>
  _Var4;
  int local_54;
  undefined1 local_50 [8];
  value_type entry;
  _Self local_20;
  iterator i;
  string *dir_local;
  cmOrderDirectories *this_local;
  
  i._M_node = (_Base_ptr)dir;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->DirectoryIndex,dir);
  entry._32_8_ = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::end(&this->DirectoryIndex);
  bVar1 = std::operator==(&local_20,(_Self *)&entry.second);
  __x = i;
  if (bVar1) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->OriginalDirectories);
    local_54 = (int)sVar2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::pair<int,_true>((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       *)local_50,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __x._M_node,&local_54);
    _Var4 = std::
            map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
            ::insert<std::pair<std::__cxx11::string_const,int>&>
                      ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                        *)&this->DirectoryIndex,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        *)local_50);
    local_20._M_node = (_Base_ptr)_Var4.first._M_node;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OriginalDirectories,(value_type *)i._M_node);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)local_50);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&local_20);
  return ppVar3->second;
}

Assistant:

int cmOrderDirectories::AddOriginalDirectory(std::string const& dir)
{
  // Add the runtime directory with a unique index.
  std::map<std::string, int>::iterator i =
    this->DirectoryIndex.find(dir);
  if(i == this->DirectoryIndex.end())
    {
    std::map<std::string, int>::value_type
      entry(dir, static_cast<int>(this->OriginalDirectories.size()));
    i = this->DirectoryIndex.insert(entry).first;
    this->OriginalDirectories.push_back(dir);
    }

  return i->second;
}